

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

StringRef anon_unknown.dwarf_18d5be::normaliseOpt(StringRef optName)

{
  char cVar1;
  size_type in_RSI;
  char *in_RDI;
  StringRef SVar2;
  StringRef *unaff_retaddr;
  StringRef local_20;
  undefined1 in_stack_fffffffffffffff0 [16];
  
  local_20.m_start = in_RDI;
  local_20.m_size = in_RSI;
  cVar1 = Catch::StringRef::operator[](&local_20,0);
  if (cVar1 == '-') {
    Catch::StringRef::size(&local_20);
    SVar2 = Catch::StringRef::substr
                      (unaff_retaddr,in_stack_fffffffffffffff0._8_8_,in_stack_fffffffffffffff0._0_8_
                      );
  }
  else {
    SVar2.m_size = local_20.m_size;
    SVar2.m_start = local_20.m_start;
  }
  return SVar2;
}

Assistant:

Catch::StringRef normaliseOpt( Catch::StringRef optName ) {
        if ( optName[0] == '-'
#if defined(CATCH_PLATFORM_WINDOWS)
             || optName[0] == '/'
#endif
        ) {
            return optName.substr( 1, optName.size() );
        }

        return optName;
    }